

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O2

void test_uintwide_t_n_base::
     get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<1024u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<1024u,1024u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
               (uintwide_t<24U,_unsigned_char,_void,_false> *u_local,
               number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
               *u_boost,size_t count)

{
  anon_class_32_4_006e9c57 parallel_function;
  uint __res;
  uint uVar1;
  random_engine_type *prVar2;
  long lVar3;
  atomic_flag *paVar4;
  undefined4 *puVar5;
  byte bVar6;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *u_boost_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *u_local_local;
  atomic_flag rnd_lock;
  undefined4 local_120 [64];
  
  bVar6 = 0;
  u_boost_local = u_boost;
  u_local_local = u_local;
  prVar2 = my_random_generator();
  uVar1 = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  prVar2->_M_x = uVar1 % 0x7fffffff + (uint)(uVar1 % 0x7fffffff == 0);
  math::wide_integer::uintwide_t<1024U,_unsigned_int,_void,_false>::limits_helper_min<false>();
  math::wide_integer::uintwide_t<1024U,_unsigned_int,_void,_false>::limits_helper_max<false>();
  paVar4 = &rnd_lock;
  puVar5 = local_120;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined4 *)paVar4;
    paVar4 = paVar4 + (ulong)bVar6 * -8 + 4;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  rnd_lock.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  parallel_function.u_boost = &u_boost_local;
  parallel_function.u_local = &u_local_local;
  parallel_function.distribution = (distribution_type *)local_120;
  parallel_function.rnd_lock = &rnd_lock;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_base::get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<1024u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<1024u,1024u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>(math::wide_integer::uintwide_t<1024u,unsigned_int,void,false>*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<1024u,1024u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,unsigned_long)::_lambda(unsigned_long)_1_>
            (0,count,parallel_function);
  return;
}

Assistant:

static auto get_equal_random_test_values_boost_and_local_n(      OtherLocalUintType* u_local,
                                                                     OtherBoostUintType* u_boost,
                                                               const std::size_t         count) -> void
    {
      using other_local_uint_type = OtherLocalUintType;
      using other_boost_uint_type = OtherBoostUintType;

      my_random_generator().seed(util::util_pseudorandom_time_point_seed::value<typename random_engine_type::result_type>());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using distribution_type =
        WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #else
      using distribution_type =
        ::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #endif

      distribution_type distribution;

      std::atomic_flag rnd_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        count,
        [&u_local, &u_boost, &distribution, &rnd_lock](std::size_t i)
        {
          while(rnd_lock.test_and_set()) { ; }
          const other_local_uint_type a = distribution(my_random_generator());
          rnd_lock.clear();

          u_local[i] = a;                                                // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          u_boost[i] = other_boost_uint_type("0x" + hexlexical_cast(a)); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
        }
      );
    }